

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O0

TPZTransform<double> * pztopology::TPZLine::SideToSideTransform(int sidefrom,int sideto)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  double *pdVar6;
  int in_EDX;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  int j;
  int i;
  int dto;
  int dfr;
  int is;
  int nhigh;
  TPZTransform<double> *trans;
  int in_stack_0000016c;
  int in_stack_0000018c;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  TPZFMatrix<double> *in_stack_ffffffffffffffa0;
  int row;
  TPZTransform<double> *pTVar7;
  TPZTransform<double> *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_28;
  int local_18;
  
  if ((((in_ESI < 0) || (2 < in_ESI)) || (in_EDX < 0)) || (2 < in_EDX)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZLine::HigherDimensionSides sidefrom ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
    poVar4 = std::operator<<(poVar4,' ');
    pvVar5 = (void *)std::ostream::operator<<(poVar4,in_EDX);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    TPZTransform<double>::TPZTransform(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  }
  else {
    row = (int)((ulong)in_RDI >> 0x20);
    if (in_ESI == in_EDX) {
      TPZTransform<double>::TPZTransform(in_stack_ffffffffffffffc0,row);
    }
    else if (in_ESI == 2) {
      TransformElementToSide(in_stack_0000016c);
    }
    else if (in_EDX == 2) {
      TransformSideToElement(in_stack_0000018c);
    }
    else {
      for (local_18 = 0; local_18 < *(int *)(nhighdimsides + (long)in_ESI * 4);
          local_18 = local_18 + 1) {
        if (*(int *)(pztopology::highsides + (long)local_18 * 4 + (long)in_ESI * 4) == in_EDX) {
          iVar2 = *(int *)(pztopology::sidedimension + (long)in_ESI * 4);
          iVar3 = *(int *)(pztopology::sidedimension + (long)in_EDX * 4);
          pTVar7 = in_RDI;
          TPZTransform<double>::TPZTransform(in_stack_ffffffffffffffc0,row,(int)in_RDI);
          for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
            for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
              in_stack_ffffffffffffffa0 =
                   *(TPZFMatrix<double> **)
                    (sidetosidetransforms +
                    (long)local_28 * 8 +
                    (long)local_2c * 0x18 + (long)local_18 * 0x60 + (long)in_ESI * 0x60);
              TPZTransform<double>::Mult(in_RDI);
              in_stack_ffffffffffffff98 =
                   TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                              (int64_t)in_stack_ffffffffffffff90);
              *in_stack_ffffffffffffff98 = (double)in_stack_ffffffffffffffa0;
            }
            dVar1 = *(double *)
                     ((long)in_ESI * 0x60 + (long)local_18 * 0x60 + 0x2078bf8 + (long)local_28 * 8);
            in_stack_ffffffffffffff90 = TPZTransform<double>::Sum(in_RDI);
            pdVar6 = TPZFMatrix<double>::operator()
                               (in_stack_ffffffffffffffa0,(int64_t)in_stack_ffffffffffffff98,
                                (int64_t)in_stack_ffffffffffffff90);
            *pdVar6 = dVar1;
          }
          return pTVar7;
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TPZLine::SideToSideTransform highside not found sidefrom ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
      poVar4 = std::operator<<(poVar4,' ');
      pvVar5 = (void *)std::ostream::operator<<(poVar4,in_EDX);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      TPZTransform<double>::TPZTransform(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
    }
  }
  return in_RDI;
}

Assistant:

TPZTransform<> TPZLine::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "TPZLine::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(sidedimension[sidefrom]);
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
        
        if (sideto == NSides -1) {
            return TransformSideToElement(sidefrom);
        }
        
		int nhigh = nhighdimsides[sidefrom];
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[sidefrom][is] == sideto) {
				int dfr = sidedimension[sidefrom];
				int dto = sidedimension[sideto];
				TPZTransform<> trans(dto,dfr);
				int i,j;
				for(i=0; i<dto; i++) {
					for(j=0; j<dfr; j++) {
						trans.Mult()(i,j) = sidetosidetransforms[sidefrom][is][j][i];
					}
					trans.Sum()(i,0) = sidetosidetransforms[sidefrom][is][3][i];
				}
				return trans;
			}
		}
		PZError << "TPZLine::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}